

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O3

void __thiscall sha1::SHA1::processBlock(SHA1 *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t i;
  long lVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  size_t i_2;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  lVar4 = 0;
  do {
    uVar5 = *(uint *)(this->m_block + lVar4 * 4);
    auStack_184[lVar4 + 3] =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  lVar4 = 0x10;
  do {
    uVar5 = auStack_198[lVar4] ^ auStack_184[lVar4] ^ auStack_1b8[lVar4 + 2] ^ auStack_1b8[lVar4];
    auStack_184[lVar4 + 3] = uVar5 << 1 | (uint)((int)uVar5 < 0);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x50);
  uVar5 = this->m_digest[1];
  uVar1 = this->m_digest[3];
  uVar2 = this->m_digest[4];
  uVar8 = 0;
  uVar12 = uVar2;
  uVar3 = uVar1;
  uVar6 = this->m_digest[2];
  uVar7 = uVar5;
  uVar15 = this->m_digest[0];
  do {
    uVar13 = uVar15;
    uVar11 = uVar6;
    uVar9 = uVar3;
    if (uVar8 < 0x14) {
      uVar14 = (uVar11 ^ uVar9) & uVar7 ^ uVar9;
      iVar10 = 0x5a827999;
    }
    else if (uVar8 < 0x28) {
      uVar14 = uVar11 ^ uVar7 ^ uVar9;
      iVar10 = 0x6ed9eba1;
    }
    else if (uVar8 < 0x3c) {
      uVar14 = uVar9 & uVar11 | (uVar9 | uVar11) & uVar7;
      iVar10 = -0x70e44324;
    }
    else {
      uVar14 = uVar11 ^ uVar7 ^ uVar9;
      iVar10 = -0x359d3e2a;
    }
    uVar15 = uVar12 + (uVar13 << 5 | uVar13 >> 0x1b) + uVar14 + iVar10 + auStack_184[uVar8 + 3];
    uVar6 = uVar7 << 0x1e | uVar7 >> 2;
    uVar8 = uVar8 + 1;
    uVar12 = uVar9;
    uVar3 = uVar11;
    uVar7 = uVar13;
  } while (uVar8 != 0x50);
  this->m_digest[0] = uVar15 + this->m_digest[0];
  this->m_digest[1] = uVar13 + uVar5;
  this->m_digest[2] = uVar6 + this->m_digest[2];
  this->m_digest[3] = uVar11 + uVar1;
  this->m_digest[4] = uVar9 + uVar2;
  return;
}

Assistant:

void processBlock() {
    uint32_t w[80];
    for (size_t i = 0; i < 16; i++) {
      w[i] = (m_block[i * 4 + 0] << 24);
      w[i] |= (m_block[i * 4 + 1] << 16);
      w[i] |= (m_block[i * 4 + 2] << 8);
      w[i] |= (m_block[i * 4 + 3]);
    }
    for (size_t i = 16; i < 80; i++) {
      w[i] = LeftRotate((w[i - 3] ^ w[i - 8] ^ w[i - 14] ^ w[i - 16]), 1);
    }

    uint32_t a = m_digest[0];
    uint32_t b = m_digest[1];
    uint32_t c = m_digest[2];
    uint32_t d = m_digest[3];
    uint32_t e = m_digest[4];

    for (std::size_t i = 0; i < 80; ++i) {
      uint32_t f = 0;
      uint32_t k = 0;

      if (i < 20) {
        f = (b & c) | (~b & d);
        k = 0x5A827999;
      } else if (i < 40) {
        f = b ^ c ^ d;
        k = 0x6ED9EBA1;
      } else if (i < 60) {
        f = (b & c) | (b & d) | (c & d);
        k = 0x8F1BBCDC;
      } else {
        f = b ^ c ^ d;
        k = 0xCA62C1D6;
      }
      uint32_t temp = LeftRotate(a, 5) + f + e + k + w[i];
      e = d;
      d = c;
      c = LeftRotate(b, 30);
      b = a;
      a = temp;
    }

    m_digest[0] += a;
    m_digest[1] += b;
    m_digest[2] += c;
    m_digest[3] += d;
    m_digest[4] += e;
  }